

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::updateTabBarGeometry(QMdiAreaPrivate *this)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  QScrollBar *pQVar2;
  QWidgetData *pQVar3;
  QWidget *this_01;
  LayoutDirection LVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int left;
  int iVar8;
  int iVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QRect local_68;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabBar == (QMdiAreaTabBar *)0x0) goto LAB_004402eb;
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  uVar5 = (**(code **)(*(long *)&(this->tabBar->super_QTabBar).super_QWidget + 0x70))();
  pQVar1 = this_00->data;
  iVar6 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).hbar;
  if ((pQVar2 != (QScrollBar *)0x0) &&
     (pQVar3 = (pQVar2->super_QAbstractSlider).super_QWidget.data,
     (pQVar3->widget_attributes & 0x8000) != 0)) {
    iVar6 = iVar6 + ~(pQVar3->crect).y2.m_i + (pQVar3->crect).y1.m_i;
  }
  iVar8 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).vbar;
  if ((pQVar2 != (QScrollBar *)0x0) &&
     (pQVar1 = (pQVar2->super_QAbstractSlider).super_QWidget.data,
     (pQVar1->widget_attributes & 0x8000) != 0)) {
    iVar8 = iVar8 + ~(pQVar1->crect).x2.m_i + (pQVar1->crect).x1.m_i;
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  iVar9 = (int)uVar5;
  iVar7 = (int)((ulong)uVar5 >> 0x20);
  switch(this->tabPosition) {
  case North:
    RVar10.m_i = 0;
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this_00,0,iVar7,0,0);
    local_48.x1.m_i = 0;
    break;
  case South:
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this_00,0,0,0,iVar7);
    RVar10.m_i = iVar6 - iVar7;
    local_48.x1.m_i = 0;
    iVar7 = iVar6;
    break;
  case West:
    LVar4 = QWidget::layoutDirection(this_00);
    if (LVar4 == LeftToRight) {
      iVar8 = 0;
      iVar7 = iVar9;
    }
    else {
      iVar8 = iVar9;
      iVar7 = 0;
    }
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this_00,iVar7,0,iVar8,0);
    local_48.x1.m_i = 0;
    RVar10.m_i = 0;
    iVar7 = iVar6;
    iVar8 = iVar9;
    break;
  case East:
    LVar4 = QWidget::layoutDirection(this_00);
    if (LVar4 == LeftToRight) {
      left = 0;
      iVar7 = iVar9;
    }
    else {
      iVar7 = 0;
      left = iVar9;
    }
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this_00,left,0,iVar7,0);
    local_48.x1.m_i = iVar8 - iVar9;
    RVar10.m_i = 0;
    iVar7 = iVar6;
    break;
  default:
    goto switchD_004401de_default;
  }
  local_48.y1.m_i = RVar10.m_i;
  local_48.y2.m_i = iVar7 + -1;
  local_48.x2.m_i = iVar8 + -1;
switchD_004401de_default:
  this_01 = (QWidget *)this->tabBar;
  LVar4 = QWidget::layoutDirection(this_00);
  local_68 = QWidget::contentsRect(this_00);
  local_58 = QStyle::visualRect(LVar4,&local_68,&local_48);
  QWidget::setGeometry(this_01,&local_58);
LAB_004402eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateTabBarGeometry()
{
    if (!tabBar)
        return;

    Q_Q(QMdiArea);
#if QT_CONFIG(tabwidget)
    Q_ASSERT(_q_tb_tabBarShapeFrom(tabShape, tabPosition) == tabBar->shape());
#endif
    const QSize tabBarSizeHint = tabBar->sizeHint();

    int areaHeight = q->height();
    if (hbar && hbar->isVisible())
        areaHeight -= hbar->height();

    int areaWidth = q->width();
    if (vbar && vbar->isVisible())
        areaWidth -= vbar->width();

    QRect tabBarRect;
#if QT_CONFIG(tabwidget)
    switch (tabPosition) {
    case QTabWidget::North:
        q->setViewportMargins(0, tabBarSizeHint.height(), 0, 0);
        tabBarRect = QRect(0, 0, areaWidth, tabBarSizeHint.height());
        break;
    case QTabWidget::South:
        q->setViewportMargins(0, 0, 0, tabBarSizeHint.height());
        tabBarRect = QRect(0, areaHeight - tabBarSizeHint.height(), areaWidth, tabBarSizeHint.height());
        break;
    case QTabWidget::East:
        if (q->layoutDirection() == Qt::LeftToRight)
            q->setViewportMargins(0, 0, tabBarSizeHint.width(), 0);
        else
            q->setViewportMargins(tabBarSizeHint.width(), 0, 0, 0);
        tabBarRect = QRect(areaWidth - tabBarSizeHint.width(), 0, tabBarSizeHint.width(), areaHeight);
        break;
    case QTabWidget::West:
        if (q->layoutDirection() == Qt::LeftToRight)
            q->setViewportMargins(tabBarSizeHint.width(), 0, 0, 0);
        else
            q->setViewportMargins(0, 0, tabBarSizeHint.width(), 0);
        tabBarRect = QRect(0, 0, tabBarSizeHint.width(), areaHeight);
        break;
    default:
        break;
    }
#endif // QT_CONFIG(tabwidget)

    tabBar->setGeometry(QStyle::visualRect(q->layoutDirection(), q->contentsRect(), tabBarRect));
}